

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O2

int x509_check_issued_with_callback(X509_STORE_CTX *ctx,X509 *x,X509 *issuer)

{
  int iVar1;
  int iVar2;
  
  iVar1 = X509_check_issued((X509 *)issuer,(X509 *)x);
  if (iVar1 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if ((ctx->param->flags & 1) != 0) {
      ctx->error = iVar1;
      ctx->current_cert = x;
      iVar1 = call_verify_cb(0,ctx);
      return iVar1;
    }
  }
  return iVar2;
}

Assistant:

int x509_check_issued_with_callback(X509_STORE_CTX *ctx, X509 *x,
                                    X509 *issuer) {
  int ret;
  ret = X509_check_issued(issuer, x);
  if (ret == X509_V_OK) {
    return 1;
  }
  // If we haven't asked for issuer errors don't set ctx
  if (!(ctx->param->flags & X509_V_FLAG_CB_ISSUER_CHECK)) {
    return 0;
  }

  ctx->error = ret;
  ctx->current_cert = x;
  return call_verify_cb(0, ctx);
}